

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O0

string * __thiscall
glcts::GeometryShaderInvalidArrayedInputVariablesTest::getGSCode_abi_cxx11_
          (string *__return_storage_ptr__,GeometryShaderInvalidArrayedInputVariablesTest *this,
          GLenum gs_input_primitive_type)

{
  ostream *poVar1;
  string local_1e0;
  GLuint local_1ac;
  stringstream local_1a8 [4];
  uint valid_array_size;
  stringstream code_sstream;
  ostream local_198;
  GLenum local_1c;
  GeometryShaderInvalidArrayedInputVariablesTest *pGStack_18;
  GLenum gs_input_primitive_type_local;
  GeometryShaderInvalidArrayedInputVariablesTest *this_local;
  
  local_1c = gs_input_primitive_type;
  pGStack_18 = this;
  this_local = (GeometryShaderInvalidArrayedInputVariablesTest *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_1ac = getValidInputVariableArraySize(this,local_1c);
  poVar1 = std::operator<<(&local_198,"${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (");
  getInputPrimitiveTypeQualifier_abi_cxx11_(&local_1e0,this,local_1c);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,") in;\nlayout (points, max_vertices = 1) out;\n\nin vec4 data[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ac + 1);
  poVar1 = std::operator<<(poVar1,"];\n\nvoid main()\n{\n    gl_Position = data[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ac);
  std::operator<<(poVar1,"];\n    EmitVertex();\n}\n");
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderInvalidArrayedInputVariablesTest::getGSCode(glw::GLenum gs_input_primitive_type) const
{
	std::stringstream  code_sstream;
	const unsigned int valid_array_size = getValidInputVariableArraySize(gs_input_primitive_type);

	code_sstream << "${VERSION}\n"
					"${GEOMETRY_SHADER_REQUIRE}\n"
					"\n"
					"layout ("
				 << getInputPrimitiveTypeQualifier(gs_input_primitive_type)
				 << ") in;\n"
					"layout (points, max_vertices = 1) out;\n"
					"\n"
					"in vec4 data["
				 << (valid_array_size + 1) << "];\n"
											  "\n"
											  "void main()\n"
											  "{\n"
											  "    gl_Position = data["
				 << valid_array_size << "];\n"
										"    EmitVertex();\n"
										"}\n";

	return code_sstream.str();
}